

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_PLTerm_Test::TestBody(ExprTest_PLTerm_Test *this)

{
  PLTermBuilder builder_00;
  PLTermBuilder PVar1;
  bool bVar2;
  undefined1 uVar3;
  long in_RDI;
  char *actual_expression;
  PLTermBuilder PVar4;
  AssertionResult gtest_ar_14;
  Reference arg;
  AssertionFailure *e_5;
  bool gtest_caught_expected_4;
  string gtest_expected_message_4;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionFailure *e_4;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_11;
  AssertionFailure *e_3;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionFailure *e_2;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_7;
  AssertionFailure *e_1;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Reference var;
  PLTermBuilder builder;
  AssertionResult gtest_ar_;
  PLTerm e;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffff8b8;
  AssertionResult *in_stack_fffffffffffff8c0;
  AssertHelper *this_00;
  Reference *in_stack_fffffffffffff8c8;
  PLTermBuilder *expected;
  ExprBase in_stack_fffffffffffff8d0;
  char *in_stack_fffffffffffff8d8;
  AssertionResult *this_01;
  int line;
  undefined7 in_stack_fffffffffffff8e0;
  undefined1 in_stack_fffffffffffff8e7;
  ExprBase in_stack_fffffffffffff8e8;
  Type type;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffff8f0;
  char *in_stack_fffffffffffff8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff900;
  char *in_stack_fffffffffffff920;
  char *in_stack_fffffffffffff928;
  undefined7 in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff937;
  AssertionResult *in_stack_fffffffffffff938;
  AssertHelper *in_stack_fffffffffffff940;
  AssertionResult *this_02;
  AssertionResult local_450;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_440;
  Impl *local_438;
  int iStack_430;
  int iStack_42c;
  BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40> local_428;
  Impl *local_420;
  PLTermBuilder local_418;
  PLTermBuilder local_3e8;
  byte local_3d2;
  undefined1 local_3d1 [33];
  AssertionResult local_3b0 [2];
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_390;
  AssertionResult local_388 [3];
  byte local_352;
  allocator<char> local_351;
  string local_350 [32];
  AssertionResult local_330 [3];
  byte local_2fa;
  allocator<char> local_2f9;
  string local_2f8 [32];
  AssertionResult local_2d8 [2];
  double local_2b8;
  undefined4 local_2ac;
  AssertionResult local_2a8 [2];
  double local_288;
  undefined4 local_27c;
  AssertionResult local_278 [3];
  byte local_242;
  allocator<char> local_241;
  string local_240 [32];
  AssertionResult local_220 [3];
  int local_1f0;
  byte local_1ea;
  allocator<char> local_1e9;
  string local_1e8 [32];
  AssertionResult local_1c8 [2];
  double local_1a8;
  undefined4 local_19c;
  AssertionResult local_198 [2];
  double local_178;
  undefined4 local_16c;
  AssertionResult local_168 [2];
  double local_148;
  undefined4 local_13c;
  AssertionResult local_138 [2];
  int local_118;
  undefined4 local_114;
  AssertionResult local_110 [2];
  int local_f0;
  undefined4 local_ec;
  AssertionResult local_e8 [2];
  Kind local_c8;
  undefined4 local_c4;
  AssertionResult local_c0;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_b0;
  Impl *local_a8;
  int iStack_a0;
  int iStack_9c;
  BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40> local_98;
  Impl *local_90;
  PLTermBuilder local_88;
  Impl *local_70;
  string local_60 [64];
  AssertionResult local_20;
  ExprBase local_10 [2];
  
  mp::PLTerm::PLTerm((PLTerm *)0x11f294);
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffff8c0,SUB81((ulong)in_stack_fffffffffffff8b8 >> 0x38,0));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,
               (char *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               in_stack_fffffffffffff928,in_stack_fffffffffffff920);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0x11f3b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11f430);
  local_70 = local_10[0].impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::PLTerm>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff8c8,
             (PLTerm)in_stack_fffffffffffff8d0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffff8c0 >> 0x20));
  local_88 = mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm
                       (in_stack_fffffffffffff8f0,
                        (int)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20));
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope
            ((PLTermBuilder *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (double)in_stack_fffffffffffff8d8);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddBreakpoint
            ((PLTermBuilder *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (double)in_stack_fffffffffffff8d8);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope
            ((PLTermBuilder *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (double)in_stack_fffffffffffff8d8);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddBreakpoint
            ((PLTermBuilder *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (double)in_stack_fffffffffffff8d8);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope
            ((PLTermBuilder *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (double)in_stack_fffffffffffff8d8);
  local_b0.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(in_stack_fffffffffffff8b8,0);
  PVar1 = local_88;
  local_a8 = local_88.impl_;
  iStack_a0 = local_88.slope_index_;
  iStack_9c = local_88.breakpoint_index_;
  PVar4._8_8_ = in_stack_fffffffffffff8f8;
  PVar4.impl_ = (Impl *)in_stack_fffffffffffff8f0;
  local_90 = (Impl *)local_b0.super_ExprBase.impl_;
  local_88 = PVar1;
  local_98.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::EndPLTerm
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),PVar4,
                  (Reference)in_stack_fffffffffffff8e8.impl_);
  local_c4 = 0x28;
  local_10[0].impl_ = (Impl *)local_98.super_ExprBase.impl_;
  local_c8 = mp::internal::ExprBase::kind((ExprBase *)0x11f585);
  testing::internal::EqHelper<false>::Compare<mp::expr::Kind,mp::expr::Kind>
            (in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0.impl_,
             (Kind *)in_stack_fffffffffffff8c8,(Kind *)in_stack_fffffffffffff8c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11f62e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0x11f691);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11f6e9);
  local_ec = 2;
  local_f0 = mp::PLTerm::num_breakpoints((PLTerm *)0x11f701);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0.impl_,
             (int *)in_stack_fffffffffffff8c8,(int *)in_stack_fffffffffffff8c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_e8);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11f7aa);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0x11f80d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11f865);
  local_114 = 3;
  local_118 = mp::PLTerm::num_slopes((PLTerm *)0x11f87d);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0.impl_,
             (int *)in_stack_fffffffffffff8c8,(int *)in_stack_fffffffffffff8c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_110);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11f926);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0x11f989);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11f9e1);
  local_13c = 0xb;
  local_148 = mp::PLTerm::slope((PLTerm *)
                                CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                                (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
  testing::internal::EqHelper<false>::Compare<int,double>
            (in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0.impl_,
             (int *)in_stack_fffffffffffff8c8,(double *)in_stack_fffffffffffff8c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_138);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11faa6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0x11fb09);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11fb61);
  local_16c = 0x16;
  local_178 = mp::PLTerm::slope((PLTerm *)
                                CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                                (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
  testing::internal::EqHelper<false>::Compare<int,double>
            (in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0.impl_,
             (int *)in_stack_fffffffffffff8c8,(double *)in_stack_fffffffffffff8c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11fc29);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0x11fc8c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11fce4);
  local_19c = 0x21;
  local_1a8 = mp::PLTerm::slope((PLTerm *)
                                CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                                (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
  testing::internal::EqHelper<false>::Compare<int,double>
            (in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0.impl_,
             (int *)in_stack_fffffffffffff8c8,(double *)in_stack_fffffffffffff8c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_198);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11fdac);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0x11fe0f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11fe67);
  testing::AssertionSuccess();
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
               (allocator<char> *)in_stack_fffffffffffff8f0);
    std::allocator<char>::~allocator(&local_1e9);
    local_1ea = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      mp::PLTerm::slope((PLTerm *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                        (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    }
    if ((local_1ea & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffff8f0,
                 (char (*) [97])in_stack_fffffffffffff8e8.impl_);
      local_1f0 = 2;
    }
    else {
      local_1f0 = 0;
    }
    std::__cxx11::string::~string(local_1e8);
    if (local_1f0 != 0) goto LAB_001201eb;
  }
  else {
LAB_001201eb:
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x120207);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0x12026a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1202c2);
  testing::AssertionSuccess();
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_220);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
               (allocator<char> *)in_stack_fffffffffffff8f0);
    std::allocator<char>::~allocator(&local_241);
    local_242 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      mp::PLTerm::slope((PLTerm *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                        (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    }
    if ((local_242 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffff8f0,
                 (char (*) [96])in_stack_fffffffffffff8e8.impl_);
      local_1f0 = 3;
    }
    else {
      local_1f0 = 0;
    }
    std::__cxx11::string::~string(local_240);
    if (local_1f0 != 0) goto LAB_00120646;
  }
  else {
LAB_00120646:
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x120662);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0x1206c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12071d);
  local_27c = 0x6f;
  local_288 = mp::PLTerm::breakpoint
                        ((PLTerm *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                         (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
  testing::internal::EqHelper<false>::Compare<int,double>
            (in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0.impl_,
             (int *)in_stack_fffffffffffff8c8,(double *)in_stack_fffffffffffff8c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_278);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1207e2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0x120845);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12089d);
  local_2ac = 0xde;
  local_2b8 = mp::PLTerm::breakpoint
                        ((PLTerm *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                         (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
  testing::internal::EqHelper<false>::Compare<int,double>
            (in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0.impl_,
             (int *)in_stack_fffffffffffff8c8,(double *)in_stack_fffffffffffff8c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2a8);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x120965);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0x1209c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x120a20);
  testing::AssertionSuccess();
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
               (allocator<char> *)in_stack_fffffffffffff8f0);
    std::allocator<char>::~allocator(&local_2f9);
    local_2fa = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      mp::PLTerm::breakpoint
                ((PLTerm *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                 (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    }
    if ((local_2fa & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffff8f0,
                 (char (*) [102])in_stack_fffffffffffff8e8.impl_);
      local_1f0 = 4;
    }
    else {
      local_1f0 = 0;
    }
    std::__cxx11::string::~string(local_2f8);
    if (local_1f0 != 0) goto LAB_00120da4;
  }
  else {
LAB_00120da4:
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x120dc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0x120e23);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x120e7b);
  testing::AssertionSuccess();
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_330);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
               (allocator<char> *)in_stack_fffffffffffff8f0);
    std::allocator<char>::~allocator(&local_351);
    local_352 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      mp::PLTerm::breakpoint
                ((PLTerm *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                 (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    }
    if ((local_352 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffff8f0,
                 (char (*) [101])in_stack_fffffffffffff8e8.impl_);
      local_1f0 = 5;
    }
    else {
      local_1f0 = 0;
    }
    std::__cxx11::string::~string(local_350);
    if (local_1f0 != 0) goto LAB_001211ff;
  }
  else {
LAB_001211ff:
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12121b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0x12127e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1212d3);
  local_390.super_ExprBase.impl_ = (ExprBase)mp::PLTerm::arg((PLTerm *)in_stack_fffffffffffff8b8);
  testing::internal::EqHelper<false>::Compare<mp::Reference,mp::Reference>
            (in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0.impl_,
             in_stack_fffffffffffff8c8,(Reference *)in_stack_fffffffffffff8c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_388);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12138a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,
               (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)in_stack_fffffffffffff8d0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0x1213ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x121445);
  this_02 = local_3b0;
  testing::AssertionSuccess();
  bVar2 = testing::AssertionResult::operator_cast_to_bool(this_02);
  PVar1.slope_index_ = local_3e8.slope_index_;
  PVar1.breakpoint_index_ = local_3e8.breakpoint_index_;
  PVar1.impl_ = local_3e8.impl_;
  if (bVar2) {
    in_stack_fffffffffffff938 = (AssertionResult *)local_3d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
               (allocator<char> *)in_stack_fffffffffffff8f0);
    std::allocator<char>::~allocator((allocator<char> *)local_3d1);
    local_3d2 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_3e8 = mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm
                            (in_stack_fffffffffffff8f0,
                             (int)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20));
    }
    if ((local_3d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffff8f0,
                 (char (*) [109])in_stack_fffffffffffff8e8.impl_);
      local_1f0 = 6;
    }
    else {
      local_1f0 = 0;
    }
    std::__cxx11::string::~string((string *)(local_3d1 + 1));
    PVar1 = local_3e8;
    if (local_1f0 == 0) goto LAB_00121888;
  }
  local_3e8 = PVar1;
  testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
  in_stack_fffffffffffff8e8.impl_ =
       (Impl *)testing::AssertionResult::failure_message((AssertionResult *)0x1217e0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffff8f0,
             (Type)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),(char *)in_stack_fffffffffffff8d0.impl_
            );
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)this_02,(Message *)in_stack_fffffffffffff938);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
  testing::Message::~Message((Message *)0x12183d);
LAB_00121888:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x121895);
  actual_expression = (char *)(in_RDI + 0x10);
  PVar4 = mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm
                    (in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8.impl_ >> 0x20)
                    );
  local_418.impl_ = PVar4.impl_;
  local_418._8_8_ = PVar4._8_8_;
  local_88.impl_ = local_418.impl_;
  local_88.slope_index_ = local_418.slope_index_;
  local_88.breakpoint_index_ = local_418.breakpoint_index_;
  expected = &local_88;
  this_00 = (AssertHelper *)0x0;
  local_418 = PVar4;
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope
            ((PLTermBuilder *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (double)in_stack_fffffffffffff8d8);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddBreakpoint
            ((PLTermBuilder *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (double)in_stack_fffffffffffff8d8);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope
            ((PLTermBuilder *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
             (double)in_stack_fffffffffffff8d8);
  local_440.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeCommonExpr(in_stack_fffffffffffff8b8,0);
  local_438 = local_88.impl_;
  iStack_430 = local_88.slope_index_;
  iStack_42c = local_88.breakpoint_index_;
  builder_00._8_8_ = in_stack_fffffffffffff8f8;
  builder_00.impl_ = (Impl *)in_stack_fffffffffffff8f0;
  local_420 = (Impl *)local_440.super_ExprBase.impl_;
  local_428.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::EndPLTerm
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),builder_00,
                  (Reference)in_stack_fffffffffffff8e8.impl_);
  type = SUB84(in_stack_fffffffffffff8e8.impl_,4);
  local_10[0].impl_ = (Impl *)local_428.super_ExprBase.impl_;
  mp::PLTerm::arg((PLTerm *)in_stack_fffffffffffff8b8);
  this_01 = &local_450;
  testing::internal::EqHelper<false>::Compare<mp::Reference,mp::Reference>
            (&this_01->success_,actual_expression,(Reference *)expected,(Reference *)this_00);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(this_01);
  line = (int)((ulong)this_01 >> 0x20);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x121a26);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8f0,type,
               (char *)CONCAT17(uVar3,in_stack_fffffffffffff8e0),line,actual_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_02,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x121a81);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x121ad6);
  return;
}

Assistant:

TEST_F(ExprTest, PLTerm) {
  mp::PLTerm e;
  EXPECT_TRUE(e == 0);
  (void)NumericExpr(e);
  ExprFactory::PLTermBuilder builder = factory_.BeginPLTerm(2);
  builder.AddSlope(11);
  builder.AddBreakpoint(111);
  builder.AddSlope(22);
  builder.AddBreakpoint(222);
  builder.AddSlope(33);
  auto var = factory_.MakeVariable(42);
  e = factory_.EndPLTerm(builder, var);
  EXPECT_EQ(expr::PLTERM, e.kind());
  EXPECT_EQ(2, e.num_breakpoints());
  EXPECT_EQ(3, e.num_slopes());
  EXPECT_EQ(11, e.slope(0));
  EXPECT_EQ(22, e.slope(1));
  EXPECT_EQ(33, e.slope(2));
  EXPECT_ASSERT(e.slope(-1), "index out of bounds");
  EXPECT_ASSERT(e.slope(3), "index out of bounds");
  EXPECT_EQ(111, e.breakpoint(0));
  EXPECT_EQ(222, e.breakpoint(1));
  EXPECT_ASSERT(e.breakpoint(-1), "index out of bounds");
  EXPECT_ASSERT(e.breakpoint(2), "index out of bounds");
  EXPECT_EQ(var, e.arg());
  EXPECT_ASSERT(factory_.BeginPLTerm(0), "invalid number of breakpoints");
  builder = factory_.BeginPLTerm(1);
  builder.AddSlope(0);
  builder.AddBreakpoint(0);
  builder.AddSlope(1);
  auto arg = factory_.MakeCommonExpr(0);
  e = factory_.EndPLTerm(builder, arg);
  EXPECT_EQ(arg, e.arg());
}